

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall CVmObjTads::invoke_finalizer(CVmObjTads *this,vm_obj_id_t self)

{
  undefined8 uVar1;
  void *pvVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  vm_obj_id_t in_ESI;
  long *in_RDI;
  vm_rcdesc rc;
  vm_val_t self_val;
  vm_val_t srcobj_val;
  err_frame_t err_cur__;
  vm_obj_id_t srcobj;
  vm_val_t val;
  char *in_stack_fffffffffffffe68;
  vm_rcdesc *in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffeb4;
  vm_val_t *in_stack_fffffffffffffeb8;
  vm_prop_id_t in_stack_fffffffffffffec6;
  vm_val_t *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffed4;
  CVmRun *in_stack_fffffffffffffed8;
  anon_union_8_8_cb74652f_for_val in_stack_fffffffffffffef0;
  uint local_108 [2];
  undefined8 local_100;
  void *local_f8;
  __jmp_buf_tag _Stack_f0;
  vm_obj_id_t local_24;
  int local_20 [5];
  vm_obj_id_t local_c;
  
  if (((G_predef_X.obj_destruct != 0) &&
      (local_c = in_ESI,
      iVar3 = (**(code **)(*in_RDI + 0x68))
                        (in_RDI,G_predef_X.obj_destruct,local_20,in_ESI,&local_24,0), iVar3 != 0))
     && ((local_20[0] == 0xb ||
         (((local_20[0] == 0xe || (local_20[0] == 0x11)) || (local_20[0] == 0x12)))))) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    local_100 = *puVar4;
    plVar5 = (long *)_ZTW11G_err_frame();
    *plVar5 = (long)local_108;
    local_108[0] = _setjmp(&_Stack_f0);
    if (local_108[0] == 0) {
      vm_val_t::set_obj((vm_val_t *)&stack0xfffffffffffffee8,local_24);
      vm_val_t::set_obj((vm_val_t *)&stack0xfffffffffffffed8,local_c);
      vm_rcdesc::vm_rcdesc(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      CVmRun::get_prop(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8
                       ,in_stack_fffffffffffffec6,in_stack_fffffffffffffeb8,
                       in_stack_fffffffffffffeb4,(vm_rcdesc *)in_stack_fffffffffffffef0.native_desc)
      ;
    }
    uVar1 = local_100;
    if (local_108[0] == 1) {
      local_108[0] = 2;
    }
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = uVar1;
    if ((local_108[0] & 0x4001) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar4 & 2) != 0) {
        plVar5 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar5 + 0x10));
      }
      pvVar2 = local_f8;
      plVar5 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar5 + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_108[0] & 2) != 0) {
      free(local_f8);
    }
  }
  return;
}

Assistant:

void CVmObjTads::invoke_finalizer(VMG_ vm_obj_id_t self)
{
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* 
     *   look up the finalization method - if it's defined, and it's a
     *   method, invoke it; otherwise do nothing 
     */
    if (G_predef->obj_destruct != VM_INVALID_PROP
        && get_prop(vmg_ G_predef->obj_destruct, &val, self, &srcobj, 0)
        && (val.typ == VM_CODEOFS
            || val.typ == VM_NATIVE_CODE
            || val.typ == VM_OBJX
            || val.typ == VM_BIFPTRX))
    {
        /* 
         *   invoke the finalizer in a protected frame, to ensure that we
         *   catch any exceptions that are thrown out of the finalizer 
         */
        err_try
        {
            vm_val_t srcobj_val;
            vm_val_t self_val;

            /* 
             *   Invoke the finalizer.  Use a recursive VM invocation,
             *   since the VM must return to the garbage collector, not to
             *   what it was doing in the enclosing stack frame. 
             */
            srcobj_val.set_obj(srcobj);
            self_val.set_obj(self);
            vm_rcdesc rc("TadsObject.finalize");
            G_interpreter->get_prop(vmg_ 0, &srcobj_val,
                                    G_predef->obj_destruct, &self_val, 0, &rc);
        }
        err_catch_disc
        {
            /* silently ignore the error */
        }
        err_end;
    }